

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary.cpp
# Opt level: O0

void __thiscall
Arbitraryunsignedlonglong::~Arbitraryunsignedlonglong(Arbitraryunsignedlonglong *this)

{
  Arbitraryunsignedlonglong *this_local;
  
  ~Arbitraryunsignedlonglong(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

DEF_TEST(unsignedlonglong, Arbitrary)
{
  testinator::Arbitrary<unsigned long long> a;
  unsigned long long v = a.generate(0,0);
  a.shrink(v);
  return true;
}